

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void filemgr_clear_stale_info_tree(filemgr *file)

{
  avl_node *paVar1;
  avl_node *node;
  avl_node *paVar2;
  avl_node *e;
  
  node = avl_first(&file->stale_info_tree);
  while (node != (avl_node *)0x0) {
    paVar2 = avl_next(node);
    avl_remove(&file->stale_info_tree,node);
    if (node[1].left != (avl_node *)0x0) {
      e = node[1].left;
      do {
        paVar1 = e->left;
        list_remove((list *)&node[1].left,(list_elem *)e);
        free(e->right);
        free(e);
        e = paVar1;
      } while (paVar1 != (avl_node *)0x0);
    }
    free(node);
    node = paVar2;
  }
  return;
}

Assistant:

void filemgr_clear_stale_info_tree(struct filemgr *file)
{
    struct avl_node *a;
    struct list_elem *e;
    struct stale_info_commit *commit;
    struct stale_info_entry *entry;

    a = avl_first(&file->stale_info_tree);
    while (a) {
        commit = _get_entry(a, struct stale_info_commit, avl);
        a = avl_next(&commit->avl);
        avl_remove(&file->stale_info_tree, &commit->avl);

        e = list_begin(&commit->doc_list);
        while (e) {
            entry = _get_entry(e, struct stale_info_entry, le);
            e = list_next(&entry->le);
            list_remove(&commit->doc_list, &entry->le);
            free(entry->ctx);
            free(entry);
        }
        free(commit);
    }
}